

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

void __thiscall Matrix3f::transpose(Matrix3f *this)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = 3;
  lVar4 = 0;
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    pfVar6 = this->m_elements + lVar7 + lVar3;
    lVar8 = lVar4;
    do {
      fVar1 = *pfVar6;
      *pfVar6 = this->m_elements[lVar7 * 3 + lVar8 + 1];
      this->m_elements[lVar7 * 3 + lVar8 + 1] = fVar1;
      pfVar6 = pfVar6 + 3;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    lVar3 = lVar3 + 3;
    lVar4 = lVar4 + 1;
    lVar7 = 1;
    bVar2 = false;
  } while (bVar5);
  return;
}

Assistant:

void Matrix3f::transpose()
{
	float temp;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = i + 1; j < 3; ++j )
		{
			temp = ( *this )( i, j );
			( *this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}